

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O0

_Bool textui_get_curse(int *choice,object *obj,char *dice_string)

{
  wchar_t wVar1;
  wchar_t curse;
  char *dice_string_local;
  object *obj_local;
  int *choice_local;
  
  wVar1 = curse_menu(obj,dice_string);
  if (wVar1 != L'\0') {
    *choice = wVar1;
  }
  return wVar1 != L'\0';
}

Assistant:

bool textui_get_curse(int *choice, struct object *obj, char *dice_string)
{
	int curse = curse_menu(obj, dice_string);
	if (curse) {
		*choice = curse;
		return true;
	}
	return false;
}